

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_AsmLabel(SyntaxDumper *this,ExtGNU_AsmLabelSyntax *node)

{
  SyntaxToken local_50;
  
  ExtGNU_AsmLabelSyntax::asmKeyword(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  ExtGNU_AsmLabelSyntax::openParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->strLit_);
  ExtGNU_AsmLabelSyntax::closeParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_AsmLabel(const ExtGNU_AsmLabelSyntax* node) override
    {
        terminal(node->asmKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->stringLiteral());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }